

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::newColorTypedIn(QColorDialogPrivate *this,QRgb rgb)

{
  long lVar1;
  int in_ESI;
  QColorPicker *in_RDI;
  long in_FS_OFFSET;
  int v;
  int s;
  int h;
  int in_stack_00000068;
  int in_stack_0000006c;
  int v_00;
  int in_stack_ffffffffffffffd8;
  QColorPicker *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[8].crossVisible & 1U) == 0) {
    this_00 = in_RDI;
    rgb2hsv(0xaaaaaaaa,(int *)in_RDI,(int *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),(int *)in_RDI
           );
    v_00 = (int)((ulong)in_RDI >> 0x20);
    QtPrivate::QColorPicker::setCol(this_00,in_stack_0000006c,in_stack_00000068);
    QtPrivate::QColorLuminancePicker::setCol
              ((QColorLuminancePicker *)this_00,in_ESI,in_stack_ffffffffffffffd8,v_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::newColorTypedIn(QRgb rgb)
{
    if (!nativeDialogInUse) {
        int h, s, v;
        rgb2hsv(rgb, h, s, v);
        cp->setCol(h, s);
        lp->setCol(h, s, v);
    }
}